

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  anon_unknown_24 *this_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar1;
  string_view name;
  string_view element_name;
  string error;
  FileDescriptor *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  code *pcStack_58;
  string *local_50;
  undefined8 local_48;
  string local_40;
  
  this_00 = (anon_unknown_24 *)file->package_->_M_string_length;
  if (this_00 != (anon_unknown_24 *)0x0) {
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_dataplus._M_p._0_1_ = 0;
    name._M_str = (char *)&local_50;
    name._M_len = (size_t)(file->package_->_M_dataplus)._M_p;
    local_68 = file;
    bVar1 = anon_unknown_24::IsValidLowerSnakeCaseName(this_00,name,local_50);
    if (!bVar1) {
      local_40.field_2._M_allocated_capacity = (size_type)&local_68;
      local_60 = &local_40.field_2;
      pcStack_58 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::FileDescriptor,google::protobuf::FileDescriptorProto>(google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.obj = local_60;
      element_name._M_str = (file->name_->_M_dataplus)._M_p;
      element_name._M_len = file->name_->_M_string_length;
      local_40.field_2._8_8_ = &local_50;
      AddError(this,element_name,&proto->super_Message,NAME,make_error);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(const FileDescriptor* file,
                                            const FileDescriptorProto& proto) {
  // Ignore empty packages for style checks.
  if (file->package().empty()) {
    return;
  }
  std::string error;
  if (!IsValidLowerSnakeCaseName(file->package(), &error)) {
    AddError(file->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("Package name ", file->package(), " ", error,
                          kNamingStyleOptOutMessage);
    });
  }
}